

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O0

void CS248::Collada::ColladaParser::uri_load(XMLElement *xml)

{
  char *pcVar1;
  mapped_type in_RDI;
  XMLElement *child;
  string id;
  mapped_type in_stack_ffffffffffffff98;
  XMLNode *in_stack_ffffffffffffffa0;
  XMLElement *in_stack_ffffffffffffffa8;
  XMLElement *local_48;
  allocator local_29;
  key_type *in_stack_ffffffffffffffd8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyxml2::XMLElement_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyxml2::XMLElement_*>_>_>
  *in_stack_ffffffffffffffe0;
  XMLElement *in_stack_fffffffffffffff0;
  
  pcVar1 = tinyxml2::XMLElement::Attribute
                     (in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                      (char *)in_stack_ffffffffffffff98);
  if (pcVar1 != (char *)0x0) {
    pcVar1 = tinyxml2::XMLElement::Attribute
                       (in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                        (char *)in_stack_ffffffffffffff98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&stack0xffffffffffffffd8,pcVar1,&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    in_stack_ffffffffffffffa0 =
         (XMLNode *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyxml2::XMLElement_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyxml2::XMLElement_*>_>_>
         ::operator[](in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffa0->_vptr_XMLNode = (_func_int **)in_RDI;
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
    in_stack_ffffffffffffff98 = in_RDI;
  }
  local_48 = tinyxml2::XMLNode::FirstChildElement
                       (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
  while (local_48 != (XMLElement *)0x0) {
    uri_load(in_stack_fffffffffffffff0);
    local_48 = tinyxml2::XMLNode::NextSiblingElement
                         (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98);
  }
  return;
}

Assistant:

void ColladaParser::uri_load(XMLElement* xml) {
  if (xml->Attribute("id")) {
    string id = xml->Attribute("id");
    sources[id] = xml;
  }

  XMLElement* child = xml->FirstChildElement();
  while (child) {
    uri_load(child);
    child = child->NextSiblingElement();
  }
}